

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  DynamicBlock *block_00;
  DynamicBlock *pDVar1;
  DynamicBlock *pDVar2;
  bool bVar3;
  long in_RSI;
  ZoneAllocator *in_RDI;
  DynamicBlock *next;
  DynamicBlock *prev;
  DynamicBlock *block;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  undefined1 local_28 [32];
  undefined1 *local_8;
  
  local_8 = local_28;
  if (*(long *)in_RDI == 0) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  block_00 = *(DynamicBlock **)(in_RSI + -8);
  bVar3 = ZoneAllocator_hasDynamicBlock(in_RDI,block_00);
  if (!bVar3) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  pDVar1 = block_00->prev;
  pDVar2 = block_00->next;
  if (pDVar1 == (DynamicBlock *)0x0) {
    *(DynamicBlock **)(in_RDI + 0x58) = pDVar2;
  }
  else {
    pDVar1->next = pDVar2;
  }
  if (pDVar2 != (DynamicBlock *)0x0) {
    pDVar2->prev = pDVar1;
  }
  free(block_00);
  return;
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}